

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract.h
# Opt level: O3

void __thiscall ContractFrameProtector::~ContractFrameProtector(ContractFrameProtector *this)

{
  if (g_contract_current_frame == (ContractFrame *)0x0) {
    __assert_fail("g_contract_current_frame != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/contract.h"
                  ,0x51,"ContractFrameProtector::~ContractFrameProtector()");
  }
  g_contract_current_frame = g_contract_current_frame->parent;
  if (g_contract_current_frame != (ContractFrame *)0x0) {
    operator_delete(this->protected_frame,0x18);
    return;
  }
  __assert_fail("g_contract_current_frame != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/contract.h"
                ,0x53,"ContractFrameProtector::~ContractFrameProtector()");
}

Assistant:

~ContractFrameProtector() {
    assert(g_contract_current_frame != nullptr);
    g_contract_current_frame = g_contract_current_frame->GetParent();
    assert(g_contract_current_frame != nullptr);
    delete protected_frame;
  }